

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O2

void __thiscall
Lib::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>
::
Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>*,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node*,Kernel::TypedTermList,bool,bool>
          (Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator,Lib::DefaultReset,Lib::DefaultKeepRecycled>
           *this,SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *a,Node *as,
          TypedTermList as_1,bool as_2,bool as_3)

{
  undefined1 local_4a;
  undefined1 local_49;
  Node *local_48;
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *local_40;
  uint64_t local_38;
  uint64_t local_30;
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> **local_28;
  Node **local_20;
  uint64_t *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_30 = (uint64_t)as_1._sort._content;
  local_38 = (uint64_t)as_1.super_TermList._content;
  local_18 = &local_38;
  local_28 = &local_40;
  local_20 = &local_48;
  local_10 = &local_49;
  local_8 = &local_4a;
  local_4a = as_3;
  local_49 = as_2;
  local_48 = as;
  local_40 = a;
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::
  Recycled<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>_*,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node_*,_Kernel::TypedTermList,_bool,_bool>
  ::anon_class_40_5_898dd9c1::operator()((anon_class_40_5_898dd9c1 *)this);
  return;
}

Assistant:

Recycled(A a, As... as) 
    : _self([&](){ 
        if (mem().isNonEmpty()) {
          auto elem = mem().pop();
          elem->init(std::move(a), std::move(as)...);
          return elem;
        } else {
          return IF_USE_PTRS(std::make_unique<T>, T)(std::move(a), std::move(as)...);
        }
    }())
  { }